

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

Graph * Omega_h::edges_across_tris(Graph *__return_storage_ptr__,Adj *f2e,Adj *e2f)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  allocator local_239;
  Adj local_238;
  Write<signed_char> local_208;
  Write<int> local_1f8;
  Write<int> local_1e8;
  LOs e2ee;
  LOs e2ef;
  Write<int> ee2e;
  Write<int> local_1a0;
  Write<int> local_190;
  Write<int> local_180;
  Write<int> local_170;
  Write<int> local_160;
  Read<int> e2ee_degrees;
  Write<int> local_140;
  LOs e2ef_degrees;
  Read<signed_char> e2ef_codes;
  LOs ef2f;
  LOs fe2e;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  type functor;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,(allocator *)&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functor,
                 &local_d0,":");
  std::__cxx11::to_string(&local_f0,0x215);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functor,
                 &local_f0);
  begin_code("edges_across_tris",(char *)local_238.super_Graph.a2ab.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&functor);
  std::__cxx11::string::~string((string *)&local_d0);
  Write<int>::Write(&fe2e.write_,&(f2e->super_Graph).ab2b.write_);
  Write<int>::Write(&e2ef.write_,(Write<int> *)e2f);
  Write<int>::Write(&ef2f.write_,&(e2f->super_Graph).ab2b.write_);
  Write<signed_char>::Write(&e2ef_codes.write_,&(e2f->codes).write_);
  if (((ulong)e2ef.write_.shared_alloc_.alloc & 1) == 0) {
    uVar9 = (e2ef.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar9 = (ulong)e2ef.write_.shared_alloc_.alloc >> 3;
  }
  Write<int>::Write(&local_140,&e2ef.write_);
  std::__cxx11::string::string((string *)&local_238,"",(allocator *)&functor);
  get_degrees((Omega_h *)&e2ef_degrees,(LOs *)&local_140,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  Write<int>::~Write(&local_140);
  Write<int>::Write(&local_160,&e2ef_degrees.write_);
  multiply_each_by<int>((Omega_h *)&e2ee_degrees,(Read<int> *)&local_160,2);
  Write<int>::~Write(&local_160);
  Write<int>::Write(&local_170,&e2ee_degrees.write_);
  std::__cxx11::string::string((string *)&local_238,"edges to edge edges",(allocator *)&functor);
  offset_scan<int>((Omega_h *)&e2ee,(Read<int> *)&local_170,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  Write<int>::~Write(&local_170);
  iVar4 = Read<int>::last((Read<signed_char> *)&e2ee);
  std::__cxx11::string::string((string *)&local_238,"edge edges to edges",(allocator *)&functor);
  Write<int>::Write(&ee2e,iVar4,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  Write<int>::Write((Write<int> *)&functor,&e2ef.write_);
  Write<int>::Write(&functor.e2ee.write_,&e2ee.write_);
  Write<int>::Write(&functor.ef2f.write_,&ef2f.write_);
  Write<signed_char>::Write(&functor.e2ef_codes.write_,&e2ef_codes.write_);
  Write<int>::Write(&functor.fe2e.write_,&fe2e.write_);
  Write<int>::Write(&functor.ee2e,&ee2e);
  std::__cxx11::string::string
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_239);
  std::operator+(&local_d0,&local_f0,":");
  std::__cxx11::to_string(&local_50,0x54);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                 &local_d0,&local_50);
  begin_code("parallel_for",(char *)local_238.super_Graph.a2ab.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (1 < (int)(uVar9 >> 2)) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_238,(Write<int> *)&functor);
    Write<int>::Write(&local_238.super_Graph.ab2b.write_,&functor.e2ee.write_);
    Write<int>::Write((Write<int> *)&local_238.codes,&functor.ef2f.write_);
    Write<signed_char>::Write(&local_208,&functor.e2ef_codes.write_);
    Write<int>::Write(&local_1f8,&functor.fe2e.write_);
    Write<int>::Write(&local_1e8,&functor.ee2e);
    entering_parallel = 0;
    for (uVar5 = 0; uVar5 != ((uVar9 >> 2) + 0xffffffff & 0xffffffff); uVar5 = uVar5 + 1) {
      iVar4 = *(int *)((long)local_238.super_Graph.a2ab.write_.shared_alloc_.direct_ptr + uVar5 * 4)
      ;
      uVar6 = *(int *)((long)local_238.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                      uVar5 * 4 + 4) - iVar4;
      iVar1 = *(int *)((long)local_238.super_Graph.ab2b.write_.shared_alloc_.direct_ptr + uVar5 * 4)
      ;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        cVar8 = *(char *)((long)local_208.shared_alloc_.direct_ptr + uVar7 + (long)iVar4) >> 3;
        lVar3 = (long)*(int *)((long)local_238.codes.write_.shared_alloc_.direct_ptr +
                              uVar7 * 4 + (long)iVar4 * 4) * 3;
        uVar2 = *(undefined4 *)
                 ((long)local_1f8.shared_alloc_.direct_ptr +
                 (long)((int)((char)(cVar8 + '\x02') % '\x03') + (int)lVar3) * 4);
        *(undefined4 *)((long)local_1e8.shared_alloc_.direct_ptr + uVar7 * 8 + (long)iVar1 * 4) =
             *(undefined4 *)
              ((long)local_1f8.shared_alloc_.direct_ptr +
              ((int)((char)(cVar8 + '\x01') % '\x03') + lVar3) * 4);
        *(undefined4 *)((long)local_1e8.shared_alloc_.direct_ptr + uVar7 * 8 + (long)iVar1 * 4 + 4)
             = uVar2;
      }
    }
    edges_across_tris(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&local_238);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  Write<int>::Write(&local_180,&e2ee.write_);
  Write<int>::Write(&local_1a0,&ee2e);
  Read<int>::Read((Read<signed_char> *)&local_190,&local_1a0);
  Adj::Adj(&local_238,(LOs *)&local_180,(LOs *)&local_190);
  Graph::Graph(__return_storage_ptr__,&local_238.super_Graph);
  Adj::~Adj(&local_238);
  Write<int>::~Write(&local_190);
  Write<int>::~Write(&local_1a0);
  Write<int>::~Write(&local_180);
  edges_across_tris(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&functor);
  Write<int>::~Write(&ee2e);
  Write<int>::~Write(&e2ee.write_);
  Write<int>::~Write(&e2ee_degrees.write_);
  Write<int>::~Write(&e2ef_degrees.write_);
  Write<signed_char>::~Write(&e2ef_codes.write_);
  Write<int>::~Write(&ef2f.write_);
  Write<int>::~Write(&e2ef.write_);
  Write<int>::~Write(&fe2e.write_);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return __return_storage_ptr__;
}

Assistant:

Graph edges_across_tris(Adj const f2e, Adj const e2f) {
  OMEGA_H_TIME_FUNCTION;
  auto const fe2e = f2e.ab2b;
  auto const e2ef = e2f.a2ab;
  auto const ef2f = e2f.ab2b;
  auto const e2ef_codes = e2f.codes;
  auto const ne = e2ef.size() - 1;
  auto const e2ef_degrees = get_degrees(e2ef);
  auto const e2ee_degrees = multiply_each_by(e2ef_degrees, 2);
  auto const e2ee = offset_scan(e2ee_degrees, "edges to edge edges");
  auto const nee = e2ee.last();
  Write<LO> ee2e(nee, "edge edges to edges");
  auto functor = OMEGA_H_LAMBDA(LO e) {
    auto const ef_begin = e2ef[e];
    auto const ef_end = e2ef[e + 1];
    auto const neef = ef_end - ef_begin;
    auto const ee_begin = e2ee[e];
    for (Int eef = 0; eef < neef; ++eef) {
      auto const ef = ef_begin + eef;
      auto const f = ef2f[ef];
      auto const e2ef_code = e2ef_codes[ef];
      auto const ffe = code_which_down(e2ef_code);
      auto const e1 = fe2e[f * 3 + ((ffe + 1) % 3)];
      auto const e2 = fe2e[f * 3 + ((ffe + 2) % 3)];
      ee2e[ee_begin + eef * 2 + 0] = e1;
      ee2e[ee_begin + eef * 2 + 1] = e2;
    }
  };
  parallel_for(ne, std::move(functor));
  return Adj(e2ee, ee2e);
}